

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirEND(void)

{
  int iVar1;
  int local_14;
  char *pcStack_10;
  aint val;
  char *p;
  
  pcStack_10 = lp;
  iVar1 = ParseExpression(&lp,&local_14);
  if (iVar1 == 0) {
    lp = pcStack_10;
  }
  else if ((local_14 < 0x10000) && (-1 < local_14)) {
    StartAddress = local_14;
  }
  else {
    ErrorInt("[END] Invalid address",4,PASS3);
  }
  IsRunning = 0;
  return;
}

Assistant:

static void dirEND() {
	char* p = lp;
	aint val;
	if (ParseExpression(lp, val)) {
		if (val > 65535 || val < 0) ErrorInt("[END] Invalid address", IF_FIRST);
		else 						StartAddress = val;
	} else {
		lp = p;
	}

	IsRunning = 0;
}